

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_function_call
          (irGenerator *this,string *retName,SymbolKind kind,string *funcName,
          vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *params,bool begin)

{
  bool bVar1;
  iterator this_00;
  string *in_RCX;
  int in_EDX;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *in_RSI;
  string *in_RDI;
  byte in_R9B;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  var;
  iterator __end1;
  iterator __begin1;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  shared_ptr<mir::inst::Inst> callInst;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> paramValues;
  shared_ptr<mir::inst::VarId> destVarId;
  CallInst *in_stack_fffffffffffffe38;
  VarId *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe48;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *in_stack_fffffffffffffe50;
  int iVar2;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 uVar3;
  CallInst *in_stack_fffffffffffffe90;
  LeftVal *in_stack_fffffffffffffe98;
  irGenerator *in_stack_fffffffffffffea0;
  string local_158 [48];
  shared_ptr<mir::inst::CallInst> local_128;
  RightVal *in_stack_fffffffffffffef0;
  irGenerator *in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff17;
  shared_ptr<mir::inst::Inst> *in_stack_ffffffffffffff18;
  __normal_iterator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_d8 [4];
  undefined1 local_b1;
  shared_ptr<mir::inst::Inst> local_68 [3];
  byte local_29;
  int local_14;
  
  local_29 = in_R9B & 1;
  local_14 = in_EDX;
  std::shared_ptr<mir::inst::VarId>::shared_ptr((shared_ptr<mir::inst::VarId> *)0x25f983);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector
            ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)0x25f990);
  std::shared_ptr<mir::inst::Inst>::shared_ptr((shared_ptr<mir::inst::Inst> *)0x25f99d);
  if (local_14 != 0) {
    if (local_14 == 1) {
      in_stack_fffffffffffffe50 =
           (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)operator_new(0x10);
      mir::inst::VarId::VarId
                (in_stack_fffffffffffffe40,(uint32_t)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      std::shared_ptr<mir::inst::VarId>::shared_ptr<mir::inst::VarId,void>
                ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe40,
                 (VarId *)in_stack_fffffffffffffe38);
      std::shared_ptr<mir::inst::VarId>::operator=
                ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe40,
                 (shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe38);
      std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x25fb3f);
      iVar2 = local_14;
      goto LAB_0025fb6b;
    }
    iVar2 = local_14;
    if (local_14 != 4) goto LAB_0025fb6b;
  }
  operator_new(0x10);
  local_b1 = 1;
  std::variant<int,std::__cxx11::string>::
  variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
            ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffe40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe38);
  LeftValueToLabelId(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  mir::inst::VarId::VarId
            (in_stack_fffffffffffffe40,(uint32_t)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  local_b1 = 0;
  std::shared_ptr<mir::inst::VarId>::shared_ptr<mir::inst::VarId,void>
            ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe40,
             (VarId *)in_stack_fffffffffffffe38);
  std::shared_ptr<mir::inst::VarId>::operator=
            ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe40,
             (shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe38);
  std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x25fa5f);
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x25fa6c);
  iVar2 = local_14;
LAB_0025fb6b:
  local_d8[0]._M_current =
       (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffe38);
  this_00 = std::
            vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffe38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffe40,
                            (__normal_iterator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffe38), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator*(local_d8);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe40,
              (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe38);
    rightValueToValue(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::__shared_ptr_access<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffe40);
    std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::push_back
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x25fc27);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x25fc34);
    __gnu_cxx::
    __normal_iterator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(local_d8);
  }
  operator_new(0x50);
  uVar3 = CONCAT13(1,(int3)in_stack_fffffffffffffe8c);
  std::__shared_ptr_access<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffe40);
  mir::inst::VarId::VarId(in_stack_fffffffffffffe40,(VarId *)in_stack_fffffffffffffe38);
  std::__cxx11::string::string(local_158,in_RCX);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector
            ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
             in_stack_fffffffffffffe90,
             (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)CONCAT44(uVar3,iVar2));
  mir::inst::CallInst::CallInst
            (in_stack_fffffffffffffe90,(VarId *)CONCAT44(uVar3,iVar2),in_RDI,in_RSI);
  std::shared_ptr<mir::inst::CallInst>::shared_ptr<mir::inst::CallInst,void>
            ((shared_ptr<mir::inst::CallInst> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38)
  ;
  std::shared_ptr<mir::inst::Inst>::operator=(local_68,&local_128);
  std::shared_ptr<mir::inst::CallInst>::~shared_ptr((shared_ptr<mir::inst::CallInst> *)0x25fd45);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~vector
            (in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_158);
  insertInstruction((irGenerator *)this_00._M_current,in_stack_ffffffffffffff18,
                    (bool)in_stack_ffffffffffffff17);
  std::shared_ptr<mir::inst::Inst>::~shared_ptr((shared_ptr<mir::inst::Inst> *)0x25fd82);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~vector
            (in_stack_fffffffffffffe50);
  std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x25fd9c);
  return;
}

Assistant:

void irGenerator::ir_function_call(string retName, symbol::SymbolKind kind,
                                   string funcName,
                                   std::vector<RightVal> params, bool begin) {
  shared_ptr<VarId> destVarId;
  std::vector<Value> paramValues;
  shared_ptr<mir::inst::Inst> callInst;

  switch (kind) {
    case front::symbol::SymbolKind::Ptr:
    case front::symbol::SymbolKind::INT: {
      destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(retName)));
      break;
    }
    case front::symbol::SymbolKind::VID: {
      destVarId = shared_ptr<VarId>(new VarId(_VoidVarId));
      break;
    }
    default:
      break;
  }

  for (auto var : params) {
    paramValues.push_back(*rightValueToValue(var));
  }

  callInst = shared_ptr<mir::inst::CallInst>(
      new mir::inst::CallInst(*destVarId, funcName, paramValues));

  insertInstruction(callInst, begin);
}